

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# st_string.h
# Opt level: O2

void __thiscall ST::string::set(string *this,wchar_t *wstr,size_t size,utf_validation_t validation)

{
  char_buffer local_40;
  
  if (size == 0xffffffffffffffff) {
    if (wstr == (wchar_t *)0x0) {
      size = 0;
    }
    else {
      size = wcslen(wstr);
    }
  }
  utf32_to_utf8(&local_40,wstr,size,validation);
  buffer<char>::operator=(&this->m_buffer,&local_40);
  buffer<char>::~buffer(&local_40);
  return;
}

Assistant:

void set(const wchar_t *wstr, size_t size = ST_AUTO_SIZE,
                 utf_validation_t validation = ST_DEFAULT_VALIDATION)
        {
            if (size == ST_AUTO_SIZE)
                size = wstr ? std::char_traits<wchar_t>::length(wstr) : 0;
            m_buffer = wchar_to_utf8(wstr, size, validation);
        }